

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::TextureParamVerifiers::GetTexParameterFVerifier::verifyInteger
          (GetTexParameterFVerifier *this,TestContext *testCtx,GLenum target,GLenum name,
          GLint reference)

{
  bool bVar1;
  qpTestResult qVar2;
  float *pfVar3;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  MessageBuilder local_1b8;
  undefined1 local_34 [8];
  StateQueryMemoryWriteGuard<float> state;
  GLfloat referenceAsFloat;
  GLint reference_local;
  GLenum name_local;
  GLenum target_local;
  TestContext *testCtx_local;
  GetTexParameterFVerifier *this_local;
  
  state.m_value = (float)reference;
  state.m_postguard = (float)reference;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<float> *)local_34);
  pfVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float>::operator&
                     ((StateQueryMemoryWriteGuard<float> *)local_34);
  glu::CallLogWrapper::glGetTexParameterfv
            (&(this->super_TexParamVerifier).super_CallLogWrapper,target,name,pfVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float>::verifyValidity
                    ((StateQueryMemoryWriteGuard<float> *)local_34,testCtx);
  if (bVar1) {
    pfVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_float_
                       ((StateQueryMemoryWriteGuard *)local_34);
    if ((*pfVar3 != state.m_value) || (NAN(*pfVar3) || NAN(state.m_value))) {
      this_00 = tcu::TestContext::getLog(testCtx);
      tcu::TestLog::operator<<(&local_1b8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [20])"// ERROR: expected ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&state.m_value);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [7])0x2b7cef6);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(StateQueryMemoryWriteGuard<float> *)local_34)
      ;
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1b8);
      qVar2 = tcu::TestContext::getTestResult(testCtx);
      if (qVar2 == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid float value");
      }
    }
  }
  return;
}

Assistant:

void GetTexParameterFVerifier::verifyInteger (tcu::TestContext& testCtx, GLenum target, GLenum name, GLint reference)
{
	DE_ASSERT(reference == GLint(GLfloat(reference))); // reference integer must have 1:1 mapping to float for this to work. Reference value is always such value in these tests

	using tcu::TestLog;

	const GLfloat referenceAsFloat = GLfloat(reference);

	StateQueryMemoryWriteGuard<GLfloat> state;
	glGetTexParameterfv(target, name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state != referenceAsFloat)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected " << referenceAsFloat << "; got " << state << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid float value");
	}
}